

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesnetworkpython.cpp
# Opt level: O0

PyObject *
vecToList<HighFreqDataType>::convert
          (vector<HighFreqDataType,_std::allocator<HighFreqDataType>_> *vec)

{
  object_base *this;
  HighFreqDataType *pHVar1;
  PyObject *pPVar2;
  vector<HighFreqDataType,_std::allocator<HighFreqDataType>_> *in_RDI;
  size_t i;
  list *l;
  HighFreqDataType *pHVar3;
  HighFreqDataType *x;
  list *in_stack_ffffffffffffffe0;
  
  this = (object_base *)operator_new(8);
  boost::python::list::list((list *)0x39e053);
  pHVar3 = (HighFreqDataType *)0x0;
  while( true ) {
    x = pHVar3;
    pHVar1 = (HighFreqDataType *)
             std::vector<HighFreqDataType,_std::allocator<HighFreqDataType>_>::size(in_RDI);
    if (pHVar1 <= pHVar3) break;
    std::vector<HighFreqDataType,_std::allocator<HighFreqDataType>_>::operator[]
              (in_RDI,(size_type)x);
    boost::python::list::append<HighFreqDataType>(in_stack_ffffffffffffffe0,x);
    pHVar3 = (HighFreqDataType *)((long)&(x->super_NetworkDataType)._vptr_NetworkDataType + 1);
  }
  pPVar2 = boost::python::api::object_base::ptr(this);
  return pPVar2;
}

Assistant:

static PyObject* convert(const std::vector<T>& vec){
        list* l = new list();
        for(size_t i = 0; i < vec.size(); i++){
            l->append(vec[i]);
        }
        return l->ptr();
    }